

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
          (IntrusiveListTest *this,TestObjectList *list,vector<int,_std::allocator<int>_> *expected)

{
  const_iterator *pcVar1;
  bool bVar2;
  reference pTVar3;
  long lVar4;
  char *message;
  TestObject *message_00;
  size_t sVar5;
  const_iterator rhs;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  size_t count;
  const_iterator __begin2;
  AssertHelper local_38;
  
  count = 0;
  __begin2.node_ = (TestObject *)(this->super_Test)._vptr_Test;
  sVar5 = 1;
  lVar4 = 0;
  __begin2.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)this;
  do {
    rhs.node_ = (TestObject *)0x0;
    rhs.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)this;
    bVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator!=
                      (&__begin2,rhs);
    if (!bVar2) {
      gtest_ar._0_8_ = (long)list->last_ - (long)list->first_ >> 2;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&__begin2,"count","expected.size()",&count,(unsigned_long *)&gtest_ar);
      if ((char)__begin2.list_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar);
        if (__begin2.node_ == (TestObject *)0x0) {
          message_00 = (TestObject *)0x2899b2;
        }
        else {
          message_00 = ((__begin2.node_)->
                       super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0x5b,(char *)message_00);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
      }
      pcVar1 = &__begin2;
LAB_001f9289:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pcVar1->node_);
      return;
    }
    pTVar3 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator*
                       (&__begin2);
    count = sVar5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected[count++]","node.data",
               (int *)((long)&(list->first_->
                              super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ +
                      lVar4),&pTVar3->data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                 ,0x59,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58);
      pcVar1 = (const_iterator *)&gtest_ar;
      goto LAB_001f9289;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator::operator++(&__begin2);
    sVar5 = sVar5 + 1;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void AssertListEq(const TestObjectList& list,
                    const std::vector<int>& expected) {
    size_t count = 0;
    for (const TestObject& node : list) {
      ASSERT_EQ(expected[count++], node.data);
    }
    ASSERT_EQ(count, expected.size());
  }